

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_twin_messenger.c
# Opt level: O0

_Bool remove_expired_twin_patch_request(void *item,void *match_context,_Bool *continue_processing)

{
  LOGGER_LOG p_Var1;
  double dVar2;
  TWIN_PATCH_OPERATION_CONTEXT *twin_patch_ctx;
  time_t current_time;
  LOGGER_LOG l;
  _Bool remove_item;
  _Bool *continue_processing_local;
  void *match_context_local;
  void *item_local;
  
  if (((item == (void *)0x0) || (match_context == (void *)0x0)) ||
     (continue_processing == (_Bool *)0x0)) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                ,"remove_expired_twin_patch_request",0x3e0,1,
                "Invalid argument (item=%p, match_context=%p, continue_processing=%p)",item,
                match_context,continue_processing);
    }
    l._7_1_ = false;
  }
  else {
    dVar2 = get_difftime(*match_context,*(time_t *)((long)item + 0x18));
    if (dVar2 < 300.0) {
      l._7_1_ = false;
      *continue_processing = false;
    }
    else {
      l._7_1_ = true;
      *continue_processing = true;
      if (*(long *)((long)item + 8) != 0) {
        (**(code **)((long)item + 8))(1,3,0,*(undefined8 *)((long)item + 0x10));
      }
      CONSTBUFFER_DecRef(*item);
      free(item);
    }
  }
  return l._7_1_;
}

Assistant:

static bool remove_expired_twin_patch_request(const void* item, const void* match_context, bool* continue_processing)
{
    bool remove_item;

    if (item == NULL || match_context == NULL || continue_processing == NULL)
    {
        LogError("Invalid argument (item=%p, match_context=%p, continue_processing=%p)", item, match_context, continue_processing);
        remove_item = false;
    }
    else
    {

        time_t current_time = *(time_t*)match_context;
        TWIN_PATCH_OPERATION_CONTEXT* twin_patch_ctx = (TWIN_PATCH_OPERATION_CONTEXT*)item;

        if (get_difftime(current_time, twin_patch_ctx->time_enqueued) >= DEFAULT_TWIN_OPERATION_TIMEOUT_SECS)
        {
            remove_item = true;
            *continue_processing = true;

            if (twin_patch_ctx->on_report_state_complete_callback != NULL)
            {
                twin_patch_ctx->on_report_state_complete_callback(TWIN_REPORT_STATE_RESULT_ERROR, TWIN_REPORT_STATE_REASON_TIMEOUT, 0, twin_patch_ctx->on_report_state_complete_context);
            }

            CONSTBUFFER_DecRef(twin_patch_ctx->data);
            free(twin_patch_ctx);
        }
        else
        {
            remove_item = false;
            *continue_processing = false;
        }
    }

    return remove_item;
}